

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_from_filep.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__filename;
  int iVar1;
  long lVar2;
  FILE *pFVar3;
  long lVar4;
  char *pcVar5;
  int err;
  undefined1 local_2c [4];
  
  prg = *argv;
  if (argc == 3) {
    __filename = argv[2];
    lVar2 = zip_open(argv[1],1,local_2c);
    if (lVar2 == 0) {
      main_cold_5();
      return 1;
    }
    pFVar3 = fopen(__filename,"rb");
    if (pFVar3 == (FILE *)0x0) {
      main_cold_4();
    }
    else {
      lVar4 = zip_source_filep(lVar2,pFVar3,0,0xffffffffffffffff);
      if (lVar4 == 0) {
        main_cold_3();
      }
      else {
        pcVar5 = strrchr(__filename,0x2f);
        if (pcVar5 == (char *)0x0) {
          pcVar5 = __filename;
        }
        lVar4 = zip_add(lVar2,pcVar5,lVar4);
        if (lVar4 == -1) {
          main_cold_2();
        }
        else {
          iVar1 = zip_close(lVar2);
          if (iVar1 != -1) {
            return 0;
          }
          main_cold_1();
        }
      }
    }
  }
  else {
    fprintf(_stderr,"usage: %s archive file\n");
  }
  return 1;
}

Assistant:

int
main(int argc, char *argv[]) {
    const char *archive;
    const char *file;
    const char *name;
    zip_t *za;
    zip_source_t *zs;
    int err;
    FILE *fp;

    prg = argv[0];

    if (argc != 3) {
	fprintf(stderr, "usage: %s archive file\n", prg);
	return 1;
    }

    archive = argv[1];
    file = argv[2];

    if ((za = zip_open(archive, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "%s: can't open zip archive '%s': %s\n", prg, archive, zip_error_strerror(&error));
	zip_error_fini(&error);
	return 1;
    }

    if ((fp = fopen(file, "rb")) == NULL) {
	fprintf(stderr, "%s: can't open input file '%s': %s\n", prg, file, strerror(errno));
	return 1;
    }

    if ((zs = zip_source_filep(za, fp, 0, -1)) == NULL) {
	fprintf(stderr, "%s: error creating file source for '%s': %s\n", prg, file, zip_strerror(za));
	return 1;
    }

    if ((name = strrchr(file, '/')) == NULL)
	name = file;

    if (zip_add(za, name, zs) == -1) {
	zip_source_free(zs);
	fprintf(stderr, "%s: can't add file '%s': %s\n", prg, file, zip_strerror(za));
	return 1;
    }

    if (zip_close(za) == -1) {
	fprintf(stderr, "%s: can't close zip archive '%s': %s\n", prg, archive, zip_strerror(za));
	return 1;
    }

    return 0;
}